

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O1

uint8_t __thiscall m6502::SBC(m6502 *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  fetch(this);
  uVar4 = (uint)this->a;
  uVar3 = this->fetched ^ 0xff;
  uVar2 = (this->status & 1) + uVar4 + uVar3;
  bVar1 = (byte)uVar2;
  this->status = (char)(((uVar2 ^ uVar4) & (uVar3 ^ uVar4)) >> 7) << 6 |
                 bVar1 & 0x80 | (bVar1 == 0) * '\x02' | this->status & 0x3c | 0xff < uVar2;
  this->a = bVar1;
  return '\x01';
}

Assistant:

uint8_t SBC()
  {
    fetch();
    uint16_t value = (uint16_t)fetched ^ 0x00FFu;
    uint16_t tmp = (uint16_t)a + value + (uint16_t)GetFlag(C);
    SetFlag(C, tmp > 255);
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    SetFlag(V, (~((uint16_t)a ^ (uint16_t)fetched) &
                ((uint16_t)a ^ (uint16_t)tmp)) &
                   0x0080u);
    a = tmp & 0x00FF;
    return 1;
  }